

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base.c
# Opt level: O1

logical pnga_locate_region(Integer g_a,Integer *lo,Integer *hi,Integer *map,Integer *proclist,
                          Integer *np)

{
  short sVar1;
  int iVar2;
  C_Integer *pCVar3;
  bool bVar4;
  bool bVar5;
  undefined8 uVar6;
  global_array_t *pgVar7;
  ulong uVar8;
  ulong uVar9;
  C_Integer CVar10;
  int iVar11;
  long lVar12;
  C_Integer CVar13;
  size_t sVar14;
  int _ndim;
  ulong uVar15;
  long lVar16;
  long lVar17;
  long lVar18;
  uint uVar19;
  uint uVar20;
  long lVar21;
  long lVar22;
  Integer *pIVar23;
  long *plVar24;
  long lVar25;
  int _index [7];
  Integer max [7];
  int proc_subscript [7];
  int procT [7];
  int procB [7];
  char err_string [256];
  long local_288;
  Integer *local_280;
  int local_238 [8];
  C_Integer **local_218;
  long local_210;
  long local_208;
  long local_200 [8];
  ulong local_1c0;
  uint local_1b8 [6];
  long lStack_1a0;
  long local_198 [8];
  uint auStack_158 [8];
  Integer local_138 [33];
  
  lVar25 = g_a + 1000;
  if ((g_a < -1000) || (_max_global_array <= lVar25)) {
    sprintf((char *)local_138,"%s: INVALID ARRAY HANDLE","nga_locate_region");
    pnga_error((char *)local_138,g_a);
  }
  if (GA[lVar25].actv == 0) {
    sprintf((char *)local_138,"%s: ARRAY NOT ACTIVE","nga_locate_region");
    pnga_error((char *)local_138,g_a);
  }
  pgVar7 = GA;
  sVar1 = GA[lVar25].ndim;
  uVar15 = (ulong)sVar1;
  if (0 < (long)uVar15) {
    uVar8 = 0;
    do {
      if (lo[uVar8] < 1) {
        return 0;
      }
      if (hi[uVar8] < lo[uVar8]) {
        return 0;
      }
      if (GA[lVar25].dims[uVar8] < hi[uVar8]) {
        return 0;
      }
      uVar8 = uVar8 + 1;
    } while (uVar15 != uVar8);
  }
  local_1c0 = (ulong)(uint)GA[lVar25].distr_type;
  local_280 = map;
  switch((ulong)(uint)GA[lVar25].distr_type) {
  case 0:
    if (0 < sVar1) {
      pCVar3 = GA[lVar25].mapc;
      uVar8 = 0;
      lVar16 = 0;
      do {
        lVar12 = lo[uVar8];
        uVar20 = (uint)((double)lVar12 * GA[lVar25].scale[uVar8]);
        uVar19 = GA[lVar25].nblock[uVar8] - 1;
        if (GA[lVar25].nblock[uVar8] != uVar20) {
          uVar19 = uVar20;
        }
        uVar9 = (ulong)(int)uVar19;
        if (lVar12 < pCVar3[lVar16 + uVar9]) {
          if ((int)uVar19 < 1) {
            uVar19 = uVar19 - 1;
LAB_0016b484:
            uVar20 = uVar19;
            bVar4 = false;
          }
          else {
            do {
              uVar20 = uVar19 - 1;
              bVar4 = pCVar3[lVar16 + (ulong)uVar20] <= lVar12;
              if (pCVar3[lVar16 + (ulong)uVar20] <= lVar12) goto LAB_0016b48f;
              uVar20 = uVar19 - 1;
              bVar5 = 0 < (int)uVar19;
              uVar19 = uVar20;
            } while (uVar20 != 0 && bVar5);
            uVar20 = 0xffffffff;
          }
        }
        else {
          uVar20 = GA[lVar25].nblock[uVar8] - 1;
          if ((int)uVar20 <= (int)uVar19) goto LAB_0016b484;
          lVar21 = 0;
          do {
            bVar4 = lVar12 < pCVar3[lVar16 + uVar9 + lVar21 + 1];
            if (lVar12 < pCVar3[lVar16 + uVar9 + lVar21 + 1]) {
              uVar20 = uVar19 + (int)lVar21;
              break;
            }
            lVar21 = lVar21 + 1;
          } while (~uVar9 + (long)GA[lVar25].nblock[uVar8] != lVar21);
        }
LAB_0016b48f:
        if (!bVar4) {
          uVar20 = GA[lVar25].nblock[uVar8] - 1;
        }
        auStack_158[uVar8 - 0x10] = uVar20;
        lVar16 = lVar16 + GA[lVar25].nblock[uVar8];
        uVar8 = uVar8 + 1;
      } while (uVar8 != uVar15);
    }
    if (0 < sVar1) {
      pCVar3 = GA[lVar25].mapc;
      uVar8 = 0;
      lVar16 = 0;
      do {
        lVar12 = hi[uVar8];
        uVar20 = (uint)((double)lVar12 * GA[lVar25].scale[uVar8]);
        uVar19 = GA[lVar25].nblock[uVar8] - 1;
        if (GA[lVar25].nblock[uVar8] != uVar20) {
          uVar19 = uVar20;
        }
        uVar9 = (ulong)(int)uVar19;
        if (lVar12 < pCVar3[lVar16 + uVar9]) {
          if ((int)uVar19 < 1) {
            uVar19 = uVar19 - 1;
LAB_0016b579:
            uVar20 = uVar19;
            bVar4 = false;
          }
          else {
            do {
              uVar20 = uVar19 - 1;
              bVar4 = pCVar3[lVar16 + (ulong)uVar20] <= lVar12;
              if (pCVar3[lVar16 + (ulong)uVar20] <= lVar12) goto LAB_0016b584;
              uVar20 = uVar19 - 1;
              bVar5 = 0 < (int)uVar19;
              uVar19 = uVar20;
            } while (uVar20 != 0 && bVar5);
            uVar20 = 0xffffffff;
          }
        }
        else {
          uVar20 = GA[lVar25].nblock[uVar8] - 1;
          if ((int)uVar20 <= (int)uVar19) goto LAB_0016b579;
          lVar21 = 0;
          do {
            bVar4 = lVar12 < pCVar3[lVar16 + uVar9 + lVar21 + 1];
            if (lVar12 < pCVar3[lVar16 + uVar9 + lVar21 + 1]) {
              uVar20 = uVar19 + (int)lVar21;
              break;
            }
            lVar21 = lVar21 + 1;
          } while (~uVar9 + (long)GA[lVar25].nblock[uVar8] != lVar21);
        }
LAB_0016b584:
        if (!bVar4) {
          uVar20 = GA[lVar25].nblock[uVar8] - 1;
        }
        auStack_158[uVar8] = uVar20;
        lVar16 = lVar16 + GA[lVar25].nblock[uVar8];
        uVar8 = uVar8 + 1;
      } while (uVar8 != uVar15);
    }
    *np = 0;
    lVar16 = 1;
    if (0 < sVar1) {
      memcpy(local_1b8,local_198,uVar15 * 4);
      lVar16 = 1;
      uVar8 = 0;
      do {
        lVar16 = lVar16 * (int)((auStack_158[uVar8] - auStack_158[uVar8 - 0x10]) + 1);
        uVar8 = uVar8 + 1;
      } while (uVar15 != uVar8);
    }
    if (lVar16 < 1) {
      return 1;
    }
    local_218 = &pgVar7[lVar25].mapc;
    local_210 = uVar15 * 2;
    uVar8 = uVar15 & 0xffffffff;
    local_200[0] = 0;
    local_208 = uVar15 - 1;
    do {
      if (sVar1 < 1) {
        CVar10 = 0;
      }
      else {
        CVar10 = 0;
        uVar9 = 0;
        lVar12 = 1;
        do {
          lVar21 = lVar12;
          if ((long)uVar9 < local_208) {
            lVar21 = pgVar7[g_a + 1000].nblock[uVar9] * lVar12;
          }
          CVar10 = CVar10 + lVar12 * (int)local_1b8[uVar9];
          uVar9 = uVar9 + 1;
          lVar12 = lVar21;
        } while (uVar15 != uVar9);
      }
      iVar11 = (int)local_1c0;
      if (iVar11 - 1U < 3) {
        uVar9 = (long)(int)CVar10 % pgVar7[lVar25].num_blocks[0];
        local_238[0] = (int)uVar9;
        if (1 < sVar1) {
          uVar9 = uVar9 & 0xffffffff;
          lVar21 = 0;
          lVar12 = CVar10;
          do {
            lVar12 = (long)((int)lVar12 - (int)uVar9) / pgVar7[g_a + 1000].num_blocks[lVar21];
            uVar9 = (long)(int)lVar12 % pgVar7[g_a + 1000].num_blocks[lVar21 + 1];
            local_238[lVar21 + 1] = (int)uVar9;
            lVar21 = lVar21 + 1;
          } while (uVar8 - 1 != lVar21);
        }
        if (0 < sVar1) {
          lVar12 = 0;
          do {
            iVar11 = *(int *)((long)local_238 + lVar12);
            lVar21 = *(long *)((long)pgVar7[g_a + 1000].block_dims + lVar12 * 2);
            *(long *)((long)local_138 + lVar12 * 2) = lVar21 * iVar11 + 1;
            lVar21 = ((long)iVar11 + 1) * lVar21;
            *(long *)((long)local_200 + lVar12 * 2 + 8U) = lVar21;
            lVar18 = *(long *)((long)pgVar7[g_a + 1000].dims + lVar12 * 2);
            if (lVar18 <= lVar21) {
              lVar21 = lVar18;
            }
            *(long *)((long)local_200 + lVar12 * 2 + 8U) = lVar21;
            lVar12 = lVar12 + 4;
          } while (uVar8 << 2 != lVar12);
        }
      }
      else if (iVar11 == 4) {
        uVar9 = (long)(int)CVar10 % pgVar7[lVar25].num_blocks[0];
        local_238[0] = (int)uVar9;
        if (1 < sVar1) {
          uVar9 = uVar9 & 0xffffffff;
          lVar21 = 0;
          lVar12 = CVar10;
          do {
            lVar12 = (long)((int)lVar12 - (int)uVar9) / pgVar7[g_a + 1000].num_blocks[lVar21];
            uVar9 = (long)(int)lVar12 % pgVar7[g_a + 1000].num_blocks[lVar21 + 1];
            local_238[lVar21 + 1] = (int)uVar9;
            lVar21 = lVar21 + 1;
          } while (uVar8 - 1 != lVar21);
        }
        if (0 < sVar1) {
          pCVar3 = *local_218;
          lVar12 = 0;
          iVar11 = 0;
          do {
            iVar2 = *(int *)((long)local_238 + lVar12);
            lVar21 = (long)iVar11 + (long)iVar2;
            *(C_Integer *)((long)local_138 + lVar12 * 2) = pCVar3[lVar21];
            if ((long)iVar2 < *(long *)((long)pgVar7[lVar25].num_blocks + lVar12 * 2) + -1) {
              lVar21 = pgVar7[lVar25].mapc[lVar21 + 1] + -1;
            }
            else {
              lVar21 = *(long *)((long)pgVar7[lVar25].dims + lVar12 * 2);
            }
            *(long *)((long)local_200 + lVar12 * 2 + 8U) = lVar21;
            iVar11 = iVar11 + *(int *)((long)pgVar7[lVar25].num_blocks + lVar12 * 2);
            lVar12 = lVar12 + 4;
          } while (uVar8 << 2 != lVar12);
        }
      }
      else if (iVar11 == 0) {
        if (pgVar7[lVar25].num_rstrctd == 0) {
          lVar12 = 1;
          if (0 < sVar1) {
            uVar9 = 0;
            do {
              lVar12 = lVar12 * pgVar7[g_a + 1000].nblock[uVar9];
              uVar9 = uVar9 + 1;
            } while (uVar15 != uVar9);
          }
          if ((CVar10 < 0) || (lVar12 <= CVar10)) {
LAB_0016b9db:
            if (0 < sVar1) {
              memset(local_138,0,uVar15 * 8);
              sVar14 = uVar15 * 8;
LAB_0016ba33:
              memset(local_200 + 1,0xff,sVar14);
            }
          }
          else if (0 < sVar1) {
            pCVar3 = pgVar7[lVar25].mapc;
            uVar9 = 0;
            lVar21 = 0;
            lVar12 = CVar10;
            do {
              lVar17 = (long)pgVar7[g_a + 1000].nblock[uVar9];
              lVar18 = lVar12 % lVar17;
              local_138[uVar9] = pCVar3[lVar18 + lVar21];
              if (lVar18 == lVar17 + -1) {
                CVar13 = pgVar7[g_a + 1000].dims[uVar9];
              }
              else {
                CVar13 = pCVar3[lVar18 + lVar21 + 1] + -1;
              }
              lVar21 = lVar21 + lVar17;
              local_200[uVar9 + 1] = CVar13;
              uVar9 = uVar9 + 1;
              lVar12 = lVar12 / lVar17;
            } while (uVar15 != uVar9);
          }
        }
        else if (CVar10 < pgVar7[lVar25].num_rstrctd) {
          lVar12 = 1;
          if (0 < sVar1) {
            uVar9 = 0;
            do {
              lVar12 = lVar12 * pgVar7[g_a + 1000].nblock[uVar9];
              uVar9 = uVar9 + 1;
            } while (uVar15 != uVar9);
          }
          if ((CVar10 < 0) || (lVar12 <= CVar10)) goto LAB_0016b9db;
          if (0 < sVar1) {
            pCVar3 = pgVar7[lVar25].mapc;
            uVar9 = 0;
            lVar21 = 0;
            lVar12 = CVar10;
            do {
              lVar17 = (long)pgVar7[g_a + 1000].nblock[uVar9];
              lVar18 = lVar12 % lVar17;
              local_138[uVar9] = pCVar3[lVar18 + lVar21];
              if (lVar18 == lVar17 + -1) {
                CVar13 = pgVar7[g_a + 1000].dims[uVar9];
              }
              else {
                CVar13 = pCVar3[lVar18 + lVar21 + 1] + -1;
              }
              lVar21 = lVar21 + lVar17;
              local_200[uVar9 + 1] = CVar13;
              uVar9 = uVar9 + 1;
              lVar12 = lVar12 / lVar17;
            } while (uVar15 != uVar9);
          }
        }
        else if (0 < sVar1) {
          memset(local_138,0,uVar8 * 8);
          sVar14 = uVar8 * 8;
          goto LAB_0016ba33;
        }
      }
      lVar12 = *np;
      if (0 < sVar1) {
        uVar9 = 0;
        do {
          lVar21 = local_138[uVar9];
          if (local_138[uVar9] < lo[uVar9]) {
            lVar21 = lo[uVar9];
          }
          map[lVar12 * local_210 + uVar9] = lVar21;
          uVar9 = uVar9 + 1;
        } while (uVar15 != uVar9);
      }
      if (0 < sVar1) {
        uVar9 = 0;
        do {
          lVar21 = local_200[uVar9 + 1];
          if (hi[uVar9] < local_200[uVar9 + 1]) {
            lVar21 = hi[uVar9];
          }
          map[uVar15 + lVar12 * local_210 + uVar9] = lVar21;
          uVar9 = uVar9 + 1;
        } while (uVar15 != uVar9);
      }
      if (pgVar7[lVar25].num_rstrctd != 0) {
        CVar10 = pgVar7[lVar25].rstrctd_list[CVar10];
      }
      proclist[local_200[0]] = CVar10;
      if (0 < sVar1) {
        uVar9 = 0;
        do {
          if ((int)local_1b8[uVar9] < (int)auStack_158[uVar9]) {
            local_1b8[uVar9] = local_1b8[uVar9] + 1;
            break;
          }
          local_1b8[uVar9] = auStack_158[uVar9 - 0x10];
          uVar9 = uVar9 + 1;
        } while (uVar15 != uVar9);
      }
      *np = *np + 1;
      local_200[0] = local_200[0] + 1;
    } while (local_200[0] != lVar16);
    break;
  case 1:
    lVar25 = GA[lVar25].block_total;
    if (lVar25 < 1) {
      lVar16 = 0;
    }
    else {
      lVar12 = 0;
      lVar16 = 0;
      do {
        pnga_distribution(g_a,lVar12,local_138,local_200 + 1);
        if (sVar1 < 1) {
LAB_0016bbbe:
          proclist[lVar16] = lVar12;
          lVar16 = lVar16 + 1;
        }
        else {
          lVar21 = 1;
          do {
            if (((local_138[lVar21 + -1] < lo[lVar21 + -1]) ||
                (hi[lVar21 + -1] < local_138[lVar21 + -1])) &&
               ((local_200[lVar21] < lo[lVar21 + -1] || (hi[lVar21 + -1] < local_200[lVar21])))) {
              bVar5 = true;
              bVar4 = false;
            }
            else {
              bVar4 = true;
              bVar5 = false;
            }
          } while ((bVar4) && (bVar4 = lVar21 < (long)uVar15, lVar21 = lVar21 + 1, bVar4));
          if (!bVar5) goto LAB_0016bbbe;
        }
        lVar12 = lVar12 + 1;
      } while (lVar12 != lVar25);
    }
    *np = lVar16;
    if (0 < lVar16) {
      lVar25 = 0;
      do {
        pnga_distribution(g_a,proclist[lVar25],local_138,local_200 + 1);
        if (0 < sVar1) {
          uVar8 = 0;
          do {
            lVar12 = local_138[uVar8];
            if (local_138[uVar8] < lo[uVar8]) {
              lVar12 = lo[uVar8];
            }
            local_280[uVar8] = lVar12;
            lVar12 = local_200[uVar8 + 1];
            if (hi[uVar8] < local_200[uVar8 + 1]) {
              lVar12 = hi[uVar8];
            }
            local_280[uVar15 + uVar8] = lVar12;
            uVar8 = uVar8 + 1;
          } while (uVar15 != uVar8);
        }
        lVar25 = lVar25 + 1;
        local_280 = local_280 + uVar15 * 2;
      } while (lVar25 != lVar16);
    }
    break;
  case 2:
  case 3:
    if (0 < sVar1) {
      uVar8 = 0;
      do {
        lVar25 = GA[g_a + 1000].block_dims[uVar8];
        lVar16 = (lo[uVar8] + -1) / lVar25;
        local_138[uVar8] = lVar16;
        local_200[uVar8 + 1] = (hi[uVar8] + -1) / lVar25;
        local_198[uVar8] = lVar16;
        uVar8 = uVar8 + 1;
      } while (uVar15 != uVar8);
    }
    lVar25 = local_200[uVar15];
    if (lVar25 < (&lStack_1a0)[uVar15]) {
      lVar16 = 0;
    }
    else {
      lVar16 = 0;
      do {
        lVar12 = local_198[0];
        if (sVar1 < 1) {
          lVar21 = 0;
        }
        else {
          lVar18 = 1;
          lVar21 = 0;
          uVar8 = uVar15;
          do {
            lVar21 = lVar21 * lVar18 + (&lStack_1a0)[uVar8];
            lVar18 = lVar18 * GA[g_a + 1000].block_dims[uVar8 + 6];
            uVar9 = uVar8 - 1;
            bVar4 = 0 < (long)uVar8;
            uVar8 = uVar9;
          } while (uVar9 != 0 && bVar4);
        }
        proclist[lVar16] = lVar21;
        if (0 < sVar1) {
          plVar24 = local_198;
          lVar21 = g_a * 0x368;
          pIVar23 = local_280;
          uVar8 = uVar15;
          do {
            pgVar7 = GA;
            lVar18 = *plVar24;
            *pIVar23 = *(long *)((long)GA[1000].block_dims + lVar21) * lVar18 + 1;
            lVar17 = (lVar18 + 1) * *(long *)((long)pgVar7[1000].block_dims + lVar21);
            pIVar23[uVar15] = lVar17;
            lVar18 = *(long *)((long)pgVar7[1000].dims + lVar21);
            if (lVar18 <= lVar17) {
              lVar17 = lVar18;
            }
            pIVar23[uVar15] = lVar17;
            plVar24 = plVar24 + 1;
            lVar21 = lVar21 + 8;
            pIVar23 = pIVar23 + 1;
            uVar8 = uVar8 - 1;
          } while (uVar8 != 0);
        }
        local_198[0] = local_198[0] + 1;
        if ((0 < sVar1) && (local_200[1] <= lVar12)) {
          lVar12 = 0;
          do {
            if (lVar12 < (long)(uVar15 - 1)) {
              local_198[lVar12] = local_138[lVar12];
              local_198[lVar12 + 1] = local_198[lVar12 + 1] + 1;
            }
          } while ((lVar12 + 1 < (long)uVar15) &&
                  (uVar6 = lVar12 + 2, lVar21 = lVar12 + 1, lVar12 = lVar12 + 1,
                  local_200[uVar6] < local_198[lVar21]));
        }
        lVar16 = lVar16 + 1;
        local_280 = local_280 + uVar15 * 2;
      } while ((&lStack_1a0)[uVar15] <= lVar25);
    }
    *np = lVar16;
    break;
  case 4:
    if (0 < sVar1) {
      pCVar3 = GA[lVar25].mapc;
      uVar8 = 0;
      lVar16 = 0;
      do {
        lVar12 = lo[uVar8];
        uVar19 = (uint)((double)lVar12 * GA[lVar25].scale[uVar8]);
        if (GA[lVar25].num_blocks[uVar8] == (long)(int)uVar19) {
          uVar19 = (int)GA[lVar25].num_blocks[uVar8] - 1;
        }
        lVar21 = (long)(int)uVar19;
        if (lVar12 < pCVar3[lVar16 + lVar21]) {
          if ((int)uVar19 < 1) {
            uVar19 = uVar19 - 1;
LAB_0016ad2b:
            bVar4 = false;
            uVar20 = uVar19;
          }
          else {
            do {
              bVar4 = pCVar3[lVar16 + (ulong)(uVar19 - 1)] <= lVar12;
              uVar20 = uVar19 - 1;
              if (pCVar3[lVar16 + (ulong)(uVar19 - 1)] <= lVar12) goto LAB_0016ad2e;
              uVar20 = uVar19 - 1;
              bVar5 = 0 < (int)uVar19;
              uVar19 = uVar20;
            } while (uVar20 != 0 && bVar5);
            uVar20 = 0xffffffff;
          }
        }
        else {
          lVar18 = GA[lVar25].num_blocks[uVar8] + -1;
          if (lVar18 <= lVar21) goto LAB_0016ad2b;
          lVar17 = (long)(int)(uVar19 + 1);
          if ((int)(uVar19 + 1) < lVar18) {
            lVar17 = lVar18;
          }
          do {
            bVar4 = lVar12 < pCVar3[lVar16 + lVar21 + 1];
            lVar22 = lVar21;
            if (lVar12 < pCVar3[lVar16 + lVar21 + 1]) break;
            lVar21 = lVar21 + 1;
            lVar22 = lVar17;
          } while (lVar21 < lVar18);
          uVar20 = (uint)lVar22;
        }
LAB_0016ad2e:
        if (!bVar4) {
          uVar20 = (int)GA[lVar25].num_blocks[uVar8] - 1;
        }
        auStack_158[uVar8 - 0x10] = uVar20;
        lVar16 = lVar16 + GA[lVar25].num_blocks[uVar8];
        uVar8 = uVar8 + 1;
      } while (uVar8 != uVar15);
    }
    if (0 < sVar1) {
      pCVar3 = GA[lVar25].mapc;
      uVar8 = 0;
      lVar16 = 0;
      do {
        lVar12 = hi[uVar8];
        uVar19 = (uint)((double)lVar12 * GA[lVar25].scale[uVar8]);
        if (GA[lVar25].num_blocks[uVar8] == (long)(int)uVar19) {
          uVar19 = (int)GA[lVar25].num_blocks[uVar8] - 1;
        }
        lVar21 = (long)(int)uVar19;
        if (lVar12 < pCVar3[lVar16 + lVar21]) {
          if ((int)uVar19 < 1) {
            uVar19 = uVar19 - 1;
LAB_0016ae12:
            bVar4 = false;
            uVar20 = uVar19;
          }
          else {
            do {
              bVar4 = pCVar3[lVar16 + (ulong)(uVar19 - 1)] <= lVar12;
              uVar20 = uVar19 - 1;
              if (pCVar3[lVar16 + (ulong)(uVar19 - 1)] <= lVar12) goto LAB_0016ae15;
              uVar20 = uVar19 - 1;
              bVar5 = 0 < (int)uVar19;
              uVar19 = uVar20;
            } while (uVar20 != 0 && bVar5);
            uVar20 = 0xffffffff;
          }
        }
        else {
          lVar18 = GA[lVar25].num_blocks[uVar8] + -1;
          if (lVar18 <= lVar21) goto LAB_0016ae12;
          lVar17 = (long)(int)(uVar19 + 1);
          if ((int)(uVar19 + 1) < lVar18) {
            lVar17 = lVar18;
          }
          do {
            bVar4 = lVar12 < pCVar3[lVar16 + lVar21 + 1];
            lVar22 = lVar21;
            if (lVar12 < pCVar3[lVar16 + lVar21 + 1]) break;
            lVar21 = lVar21 + 1;
            lVar22 = lVar17;
          } while (lVar21 < lVar18);
          uVar20 = (uint)lVar22;
        }
LAB_0016ae15:
        if (!bVar4) {
          uVar20 = (int)GA[lVar25].num_blocks[uVar8] - 1;
        }
        auStack_158[uVar8] = uVar20;
        lVar16 = lVar16 + GA[lVar25].num_blocks[uVar8];
        uVar8 = uVar8 + 1;
      } while (uVar8 != uVar15);
    }
    *np = 0;
    local_200[0] = 1;
    if (0 < sVar1) {
      memcpy(local_1b8,local_198,uVar15 * 4);
      local_200[0] = 1;
      uVar8 = 0;
      do {
        local_200[0] = local_200[0] * (int)((auStack_158[uVar8] - auStack_158[uVar8 - 0x10]) + 1);
        uVar8 = uVar8 + 1;
      } while (uVar15 != uVar8);
    }
    if (local_200[0] < 1) {
      return 1;
    }
    local_218 = &pgVar7[lVar25].mapc;
    uVar8 = uVar15 & 0xffffffff;
    local_288 = 0;
    local_208 = uVar8 << 2;
    local_210 = uVar8 - 1;
    do {
      lVar12 = local_208;
      lVar16 = local_210;
      if (sVar1 < 1) {
        lVar21 = 0;
      }
      else {
        lVar21 = 0;
        uVar9 = 0;
        lVar18 = 1;
        do {
          lVar17 = lVar18;
          if ((long)uVar9 < (long)(uVar15 - 1)) {
            lVar17 = pgVar7[g_a + 1000].num_blocks[uVar9] * lVar18;
          }
          lVar21 = lVar21 + lVar18 * (int)local_1b8[uVar9];
          uVar9 = uVar9 + 1;
          lVar18 = lVar17;
        } while (uVar15 != uVar9);
      }
      proclist[local_288] = lVar21;
      iVar11 = (int)local_1c0;
      if (iVar11 - 1U < 3) {
        uVar9 = (long)(int)lVar21 % pgVar7[lVar25].num_blocks[0];
        local_238[0] = (int)uVar9;
        if (1 < sVar1) {
          uVar9 = uVar9 & 0xffffffff;
          lVar18 = 0;
          do {
            lVar21 = (long)((int)lVar21 - (int)uVar9) / pgVar7[g_a + 1000].num_blocks[lVar18];
            uVar9 = (long)(int)lVar21 % pgVar7[g_a + 1000].num_blocks[lVar18 + 1];
            local_238[lVar18 + 1] = (int)uVar9;
            lVar18 = lVar18 + 1;
          } while (lVar16 != lVar18);
        }
        if (0 < sVar1) {
          lVar16 = 0;
          do {
            iVar11 = *(int *)((long)local_238 + lVar16);
            lVar21 = *(long *)((long)pgVar7[g_a + 1000].block_dims + lVar16 * 2);
            *(long *)((long)local_138 + lVar16 * 2) = lVar21 * iVar11 + 1;
            lVar21 = ((long)iVar11 + 1) * lVar21;
            *(long *)((long)local_200 + lVar16 * 2 + 8U) = lVar21;
            lVar18 = *(long *)((long)pgVar7[g_a + 1000].dims + lVar16 * 2);
            if (lVar18 <= lVar21) {
              lVar21 = lVar18;
            }
            *(long *)((long)local_200 + lVar16 * 2 + 8U) = lVar21;
            lVar16 = lVar16 + 4;
          } while (lVar12 != lVar16);
        }
      }
      else if (iVar11 == 4) {
        uVar9 = (long)(int)lVar21 % pgVar7[lVar25].num_blocks[0];
        local_238[0] = (int)uVar9;
        if (1 < sVar1) {
          uVar9 = uVar9 & 0xffffffff;
          lVar18 = 0;
          do {
            lVar21 = (long)((int)lVar21 - (int)uVar9) / pgVar7[g_a + 1000].num_blocks[lVar18];
            uVar9 = (long)(int)lVar21 % pgVar7[g_a + 1000].num_blocks[lVar18 + 1];
            local_238[lVar18 + 1] = (int)uVar9;
            lVar18 = lVar18 + 1;
          } while (lVar16 != lVar18);
        }
        if (0 < sVar1) {
          pCVar3 = *local_218;
          lVar16 = 0;
          iVar11 = 0;
          do {
            iVar2 = *(int *)((long)local_238 + lVar16);
            lVar21 = (long)iVar11 + (long)iVar2;
            *(C_Integer *)((long)local_138 + lVar16 * 2) = pCVar3[lVar21];
            if ((long)iVar2 < *(long *)((long)pgVar7[lVar25].num_blocks + lVar16 * 2) + -1) {
              lVar21 = pgVar7[lVar25].mapc[lVar21 + 1] + -1;
            }
            else {
              lVar21 = *(long *)((long)pgVar7[lVar25].dims + lVar16 * 2);
            }
            *(long *)((long)local_200 + lVar16 * 2 + 8U) = lVar21;
            iVar11 = iVar11 + *(int *)((long)pgVar7[lVar25].num_blocks + lVar16 * 2);
            lVar16 = lVar16 + 4;
          } while (lVar12 != lVar16);
        }
      }
      else if (iVar11 == 0) {
        if (pgVar7[lVar25].num_rstrctd == 0) {
          lVar16 = 1;
          if (0 < sVar1) {
            uVar9 = 0;
            do {
              lVar16 = lVar16 * pgVar7[g_a + 1000].nblock[uVar9];
              uVar9 = uVar9 + 1;
            } while (uVar15 != uVar9);
          }
          if ((lVar21 < 0) || (lVar16 <= lVar21)) {
LAB_0016b284:
            if (0 < sVar1) {
              memset(local_138,0,uVar15 * 8);
              sVar14 = uVar15 * 8;
LAB_0016b2dc:
              memset(local_200 + 1,0xff,sVar14);
            }
          }
          else if (0 < sVar1) {
            pCVar3 = pgVar7[lVar25].mapc;
            lVar16 = 0;
            uVar9 = 0;
            do {
              lVar18 = (long)pgVar7[g_a + 1000].nblock[uVar9];
              lVar12 = lVar21 % lVar18;
              local_138[uVar9] = pCVar3[lVar12 + lVar16];
              if (lVar12 == lVar18 + -1) {
                CVar10 = pgVar7[g_a + 1000].dims[uVar9];
              }
              else {
                CVar10 = pCVar3[lVar12 + lVar16 + 1] + -1;
              }
              lVar16 = lVar16 + lVar18;
              local_200[uVar9 + 1] = CVar10;
              uVar9 = uVar9 + 1;
              lVar21 = lVar21 / lVar18;
            } while (uVar15 != uVar9);
          }
        }
        else if (lVar21 < pgVar7[lVar25].num_rstrctd) {
          lVar16 = 1;
          if (0 < sVar1) {
            uVar9 = 0;
            do {
              lVar16 = lVar16 * pgVar7[g_a + 1000].nblock[uVar9];
              uVar9 = uVar9 + 1;
            } while (uVar15 != uVar9);
          }
          if ((lVar21 < 0) || (lVar16 <= lVar21)) goto LAB_0016b284;
          if (0 < sVar1) {
            pCVar3 = pgVar7[lVar25].mapc;
            lVar16 = 0;
            uVar9 = 0;
            do {
              lVar18 = (long)pgVar7[g_a + 1000].nblock[uVar9];
              lVar12 = lVar21 % lVar18;
              local_138[uVar9] = pCVar3[lVar12 + lVar16];
              if (lVar12 == lVar18 + -1) {
                CVar10 = pgVar7[g_a + 1000].dims[uVar9];
              }
              else {
                CVar10 = pCVar3[lVar12 + lVar16 + 1] + -1;
              }
              lVar16 = lVar16 + lVar18;
              local_200[uVar9 + 1] = CVar10;
              uVar9 = uVar9 + 1;
              lVar21 = lVar21 / lVar18;
            } while (uVar15 != uVar9);
          }
        }
        else if (0 < sVar1) {
          memset(local_138,0,uVar8 * 8);
          sVar14 = uVar8 * 8;
          goto LAB_0016b2dc;
        }
      }
      lVar16 = *np * uVar15 * 2;
      if (0 < sVar1) {
        uVar9 = 0;
        do {
          lVar12 = local_138[uVar9];
          if (local_138[uVar9] < lo[uVar9]) {
            lVar12 = lo[uVar9];
          }
          map[lVar16 + uVar9] = lVar12;
          uVar9 = uVar9 + 1;
        } while (uVar15 != uVar9);
      }
      if (0 < sVar1) {
        uVar9 = 0;
        do {
          lVar12 = local_200[uVar9 + 1];
          if (hi[uVar9] < local_200[uVar9 + 1]) {
            lVar12 = hi[uVar9];
          }
          map[uVar15 + lVar16 + uVar9] = lVar12;
          uVar9 = uVar9 + 1;
        } while (uVar15 != uVar9);
      }
      if (0 < sVar1) {
        uVar9 = 0;
        do {
          if ((int)local_1b8[uVar9] < (int)auStack_158[uVar9]) {
            local_1b8[uVar9] = local_1b8[uVar9] + 1;
            break;
          }
          local_1b8[uVar9] = auStack_158[uVar9 - 0x10];
          uVar9 = uVar9 + 1;
        } while (uVar15 != uVar9);
      }
      *np = *np + 1;
      local_288 = local_288 + 1;
    } while (local_288 != local_200[0]);
  }
  return 1;
}

Assistant:

logical pnga_locate_region( Integer g_a,
                            Integer *lo,
                            Integer *hi,
                            Integer *map,
                            Integer *proclist,
                            Integer *np)
/*    g_a      [input]  global array handle
      lo       [input]  lower indices of patch in global array
      hi       [input]  upper indices of patch in global array
      map      [output] list of lower and upper indices for portion of
                        patch that exists on each processor containing a
                        portion of the patch. The map is constructed so
                        that for a D dimensional global array, the first
                        D elements are the lower indices on the first
                        processor in proclist, the next D elements are
                        the upper indices of the first processor in
                        proclist, the next D elements are the lower
                        indices for the second processor in proclist, and
                        so on.
      proclist [output] list of processors containing some portion of the
                        patch
      np       [output] total number of processors containing a portion
                        of the patch

      For a block cyclic data distribution, this function returns a list of
      blocks that cover the region along with the lower and upper indices of
      each block.
*/
{
  int  procT[MAXDIM], procB[MAXDIM], proc_subscript[MAXDIM];
  Integer  proc, owner, i, ga_handle;
  Integer  d, dpos, ndim, elems, use_blocks;
  /* Integer  p_handle; */

  ga_check_handleM(g_a, "nga_locate_region");

  ga_handle = GA_OFFSET + g_a;

  for(d = 0; d< GA[ga_handle].ndim; d++)
    if((lo[d]<1 || hi[d]>GA[ga_handle].dims[d]) ||(lo[d]>hi[d]))return FALSE;

  ndim = GA[ga_handle].ndim;

  if (GA[ga_handle].distr_type == REGULAR) {
    /* find "processor coordinates" for the top left corner and store them
     * in ProcT */

    for(d = 0, dpos = 0; d< GA[ga_handle].ndim; d++){
      findblock(GA[ga_handle].mapc + dpos, GA[ga_handle].nblock[d], 
          GA[ga_handle].scale[d], lo[d], &procT[d]);
      dpos += GA[ga_handle].nblock[d];
    }

    /* find "processor coordinates" for the right bottom corner and store
     * them in procB */

    for(d = 0, dpos = 0; d< GA[ga_handle].ndim; d++){
      findblock(GA[ga_handle].mapc + dpos, GA[ga_handle].nblock[d], 
          GA[ga_handle].scale[d], hi[d], &procB[d]);
      dpos += GA[ga_handle].nblock[d];
    }

    *np = 0;

    /* Find total number of processors containing data and return the
     * result in elems. Also find the lowest "processor coordinates" of the
     * processor block containing data and return these in proc_subscript.
     */
    ga_InitLoopM(&elems, ndim, proc_subscript, procT,procB,GA[ga_handle].nblock);

    /* p_handle = (Integer)GA[ga_handle].p_handle; */
    for(i= 0; i< elems; i++){ 
      Integer _lo[MAXDIM], _hi[MAXDIM];
      Integer  offset;

      /* convert i to owner processor id using the current values in
         proc_subscript */
      ga_ComputeIndexM(&proc, ndim, proc_subscript, GA[ga_handle].nblock); 
      /* get range of global array indices that are owned by owner */
      ga_ownsM(ga_handle, proc, _lo, _hi);

      offset = *np *(ndim*2); /* location in map to put patch range */

      for(d = 0; d< ndim; d++)
        map[d + offset ] = lo[d] < _lo[d] ? _lo[d] : lo[d];

      for(d = 0; d< ndim; d++)
        map[ndim + d + offset ] = hi[d] > _hi[d] ? _hi[d] : hi[d];

      owner = proc;
      if (GA[ga_handle].num_rstrctd == 0) {
        proclist[i] = owner;
      } else {
        proclist[i] = GA[ga_handle].rstrctd_list[owner];
      }
      /* Update to proc_subscript so that it corresponds to the next
       * processor in the block of processors containing the patch */
      ga_UpdateSubscriptM(ndim,proc_subscript,procT,procB,GA[ga_handle].nblock);
      (*np)++;
    }
  } else if (GA[ga_handle].distr_type == TILED_IRREG) {
    Integer nproc = pnga_pgroup_nnodes(GA[ga_handle].p_handle);
    /* find "processor coordinates" for the top left corner and store them
     * in ProcT */
    for(d = 0, dpos = 0; d< GA[ga_handle].ndim; d++){
      findblock(GA[ga_handle].mapc + dpos, GA[ga_handle].num_blocks[d], 
          GA[ga_handle].scale[d], lo[d], &procT[d]);
      dpos += GA[ga_handle].num_blocks[d];
    }

    /* find "processor coordinates" for the right bottom corner and store
     * them in procB */

    for(d = 0, dpos = 0; d< GA[ga_handle].ndim; d++){
      findblock(GA[ga_handle].mapc + dpos, GA[ga_handle].num_blocks[d], 
          GA[ga_handle].scale[d], hi[d], &procB[d]);
      dpos += GA[ga_handle].num_blocks[d];
    }

    *np = 0;

    /* Find total number of processors containing data and return the
     * result in elems. Also find the lowest "processor coordinates" of the
     * processor block containing data and return these in proc_subscript.
     */
    ga_InitLoopM(&elems, ndim, proc_subscript, procT,procB,GA[ga_handle].num_blocks);

    /* p_handle = (Integer)GA[ga_handle].p_handle; */
    for(i= 0; i< elems; i++){ 
      Integer _lo[MAXDIM], _hi[MAXDIM];
      Integer  offset;

      /* convert i to owner processor id using the current values in
         proc_subscript */
      ga_ComputeIndexM(&proc, ndim, proc_subscript, GA[ga_handle].num_blocks); 
      proclist[i] = proc;
      /* get range of global array indices that are owned by owner */
      ga_ownsM(ga_handle, proc, _lo, _hi);

      offset = *np *(ndim*2); /* location in map to put patch range */


      for(d = 0; d< ndim; d++)
        map[d + offset ] = lo[d] < _lo[d] ? _lo[d] : lo[d];

      for(d = 0; d< ndim; d++)
        map[ndim + d + offset ] = hi[d] > _hi[d] ? _hi[d] : hi[d];

      /* Update to proc_subscript so that it corresponds to the next
       * processor in the block of processors containing the patch */
      ga_UpdateSubscriptM(ndim,proc_subscript,procT,procB,GA[ga_handle].num_blocks);
      (*np)++;
    }
  } else if (GA[ga_handle].distr_type == BLOCK_CYCLIC) {
    Integer nblocks = GA[ga_handle].block_total;
    Integer chk, j, tlo[MAXDIM], thi[MAXDIM], cnt;
    Integer offset;
    cnt = 0;
    for (i=0; i<nblocks; i++) {
      /* check to see if this block overlaps with requested block
       * defined by lo and hi */
      chk = 1;
      /* get limits on block i */
      pnga_distribution(g_a,i,tlo,thi);
      for (j=0; j<ndim && chk==1; j++) {
        /* check to see if at least one end point of the interval
         * represented by blo and bhi falls in the interval
         * represented by lo and hi */
        if (!((tlo[j] >= lo[j] && tlo[j] <= hi[j]) ||
              (thi[j] >= lo[j] && thi[j] <= hi[j]))) {
          chk = 0;
        }
      }
      /* store blocks that overlap request region in proclist */
      if (chk) {
        proclist[cnt] = i;
        cnt++;
      }
    }
    *np = cnt;

    /* fill map array with block coordinates */
    for (i=0; i<cnt; i++) {
      offset = i*2*ndim;
      j = proclist[i];
      pnga_distribution(g_a,j,tlo,thi);
      for (j=0; j<ndim; j++) {
        map[offset + j] = lo[j] < tlo[j] ? tlo[j] : lo[j];
        map[offset + ndim + j] = hi[j] > thi[j] ? thi[j] : hi[j];
      }
    }
  } else if (GA[ga_handle].distr_type == SCALAPACK ||
             GA[ga_handle].distr_type == TILED) {
    /* find min and max block coordinates of region */
    Integer min[MAXDIM], max[MAXDIM];
    Integer count[MAXDIM];
    Integer total_blocks = 1;
    Integer cnt = 0;
    Integer offset;
    for (i=0; i<ndim; i++) {
      min[i] = (lo[i]-1)/GA[ga_handle].block_dims[i];
      max[i] = (hi[i]-1)/GA[ga_handle].block_dims[i];
      total_blocks *= (max[i]-min[i]+1);
      count[i] = min[i];
    }
    while (count[ndim-1]<=max[ndim-1]) {
      /* Calculate block index */
      Integer idx = 0;
      Integer factor = 1;
      Integer iproc;
      Integer p_handle = GA[ga_handle].p_handle;
      Integer size = pnga_pgroup_nnodes(p_handle);
      for (i=ndim-1; i>=0; i--) {
        idx = idx*factor+count[i];
        factor *= GA[ga_handle].num_blocks[i];
      }
      proclist[cnt] = idx;
      /* store information on this block */
      offset = 2*cnt*ndim;
      for (i=0; i<ndim; i++) {
        map[offset+i] = count[i]*GA[ga_handle].block_dims[i]+1;
        map[offset+ndim+i] = (count[i]+1)*GA[ga_handle].block_dims[i];
        if (map[offset+ndim+i] > GA[ga_handle].dims[i])
          map[offset+ndim+i] = GA[ga_handle].dims[i];
      }
      cnt++;
      /* Increment count array */
      i = 0;
      count[0]++;
      while (count[i] > max[i] && i<ndim) {
        if (i<ndim-1) count[i] = min[i];
        if (i<ndim-1) {
          count[i+1]++;
        }
        i++;
      }
    }
    *np = cnt;
  }
  return(TRUE);
}